

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O0

LIST_ITEM_HANDLE
singlylinkedlist_find
          (SINGLYLINKEDLIST_HANDLE list,LIST_MATCH_FUNCTION match_function,void *match_context)

{
  _Bool _Var1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE local_40;
  LIST_ITEM_INSTANCE *current;
  LIST_INSTANCE *list_instance;
  LOGGER_LOG l;
  LIST_ITEM_HANDLE result;
  void *match_context_local;
  LIST_MATCH_FUNCTION match_function_local;
  SINGLYLINKEDLIST_HANDLE list_local;
  
  if ((list == (SINGLYLINKEDLIST_HANDLE)0x0) || (match_function == (LIST_MATCH_FUNCTION)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_find",0xe9,1,"Invalid argument (list=%p, match_function=%p)",list
                ,match_function);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    local_40 = list->head;
    while ((local_40 != (LIST_ITEM_HANDLE)0x0 &&
           (_Var1 = (*match_function)(local_40,match_context), !_Var1))) {
      local_40 = (LIST_ITEM_HANDLE)local_40->next;
    }
    if (local_40 == (LIST_ITEM_HANDLE)0x0) {
      l = (LOGGER_LOG)0x0;
    }
    else {
      l = (LOGGER_LOG)local_40;
    }
  }
  return (LIST_ITEM_HANDLE)l;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_find(SINGLYLINKEDLIST_HANDLE list, LIST_MATCH_FUNCTION match_function, const void* match_context)
{
    LIST_ITEM_HANDLE result;

    if ((list == NULL) ||
        (match_function == NULL))
    {
        LogError("Invalid argument (list=%p, match_function=%p)", list, match_function);
        /* Codes_SRS_LIST_01_012: [If the list or the match_function argument is NULL, singlylinkedlist_find shall return NULL.] */
        result = NULL;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* current = list_instance->head;

        /* Codes_SRS_LIST_01_011: [singlylinkedlist_find shall iterate through all items in a list and return the first one that satisfies a certain match function.] */
        while (current != NULL)
        {
            /* Codes_SRS_LIST_01_014: [list find shall determine whether an item satisfies the match criteria by invoking the match function for each item in the list until a matching item is found.] */
            /* Codes_SRS_LIST_01_013: [The match_function shall get as arguments the list item being attempted to be matched and the match_context as is.] */
            if (match_function((LIST_ITEM_HANDLE)current, match_context) == true)
            {
                /* Codes_SRS_LIST_01_017: [If the match function returns true, singlylinkedlist_find shall consider that item as matching.] */
                break;
            }

            /* Codes_SRS_LIST_01_016: [If the match function returns false, singlylinkedlist_find shall consider that item as not matching.] */
            current = (LIST_ITEM_INSTANCE*)current->next;
        }

        if (current == NULL)
        {
            /* Codes_SRS_LIST_01_015: [If the list is empty, singlylinkedlist_find shall return NULL.] */
            result = NULL;
        }
        else
        {
            result = current;
        }
    }

    return result;
}